

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SliderBehaviorT<unsigned_int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,uint *v,uint v_min,uint v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  float fVar1;
  int iVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  bool is_logarithmic;
  bool bVar7;
  uint uVar8;
  float logarithmic_zero_epsilon;
  float fVar9;
  float fVar10;
  ImVec2 IVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  pIVar3 = GImGui;
  iVar2 = v_min - v_max;
  if (v_min < v_max) {
    iVar2 = -(v_min - v_max);
  }
  uVar6 = flags & 0x100000;
  uVar5 = data_type & 0xfffffffe;
  is_logarithmic = (bool)((byte)((flags & 0x20U) >> 5) & uVar5 == 8);
  fVar15 = *(float *)((long)&(bb->Min).x + (ulong)(uVar6 >> 0x12));
  fVar1 = *(float *)((long)&(bb->Max).x + (ulong)(uVar6 >> 0x12));
  fVar16 = (fVar1 - fVar15) + -4.0;
  fVar13 = (GImGui->Style).GrabMinSize;
  if (-1 < iVar2 && uVar5 != 8) {
    fVar12 = fVar16 / (float)(iVar2 + 1);
    uVar8 = -(uint)(fVar13 <= fVar12);
    fVar13 = (float)(~uVar8 & (uint)fVar13 | (uint)fVar12 & uVar8);
  }
  if (fVar16 <= fVar13) {
    fVar13 = fVar16;
  }
  fVar17 = fVar16 - fVar13;
  fVar12 = 0.0;
  logarithmic_zero_epsilon = 0.0;
  if (is_logarithmic != false) {
    iVar4 = ImParseFormatPrecision(format,3);
    logarithmic_zero_epsilon = powf(0.1,(float)iVar4);
    fVar12 = fVar17;
    if (fVar17 <= 1.0) {
      fVar12 = 1.0;
    }
    fVar12 = ((pIVar3->Style).LogSliderDeadzone * 0.5) / fVar12;
  }
  fVar15 = fVar15 + 2.0 + fVar13 * 0.5;
  if (pIVar3->ActiveId != id) {
    bVar7 = false;
    goto LAB_0016cb69;
  }
  if (pIVar3->ActiveIdSource == ImGuiInputSource_Nav) {
    if (pIVar3->ActiveIdIsJustActivated == true) {
      pIVar3->SliderCurrentAccum = 0.0;
      pIVar3->SliderCurrentAccumDirty = false;
    }
    IVar11 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
    fVar17 = IVar11.x;
    if (uVar6 != 0) {
      fVar17 = -IVar11.y;
    }
    if ((fVar17 != 0.0) || (NAN(fVar17))) {
      if ((uVar5 == 8) && (iVar4 = ImParseFormatPrecision(format,3), 0 < iVar4)) {
        fVar17 = fVar17 / 100.0;
        if (0.0 < (GImGui->IO).NavInputs[0xe]) {
          fVar17 = fVar17 / 10.0;
        }
      }
      else if ((iVar2 + 100U < 0xc9) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
        fVar17 = *(float *)(&DAT_001799f0 + (ulong)(fVar17 < 0.0) * 4) / (float)iVar2;
      }
      else {
        fVar17 = fVar17 / 100.0;
      }
      uVar5 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
      pIVar3->SliderCurrentAccum =
           (float)(~uVar5 & (uint)fVar17 | (uint)(fVar17 * 10.0) & uVar5) +
           pIVar3->SliderCurrentAccum;
      pIVar3->SliderCurrentAccumDirty = true;
    }
    fVar17 = pIVar3->SliderCurrentAccum;
    if ((pIVar3->NavActivatePressedId == id) && (pIVar3->ActiveIdIsJustActivated == false)) {
      ClearActiveID();
    }
    else if (pIVar3->SliderCurrentAccumDirty == true) {
      fVar10 = ScaleRatioFromValueT<unsigned_int,int,float>
                         (data_type,*v,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,fVar12);
      if (((1.0 <= fVar10) && (0.0 < fVar17)) || ((fVar10 <= 0.0 && (fVar17 < 0.0)))) {
        fVar14 = 0.0;
        bVar7 = false;
        fVar9 = fVar10;
      }
      else {
        fVar14 = fVar17 + fVar10;
        fVar9 = 1.0;
        if (fVar14 <= 1.0) {
          fVar9 = fVar14;
        }
        fVar9 = (float)(~-(uint)(fVar14 < 0.0) & (uint)fVar9);
        uVar5 = ScaleValueFromRatioT<unsigned_int,int,float>
                          (data_type,fVar9,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,
                           fVar12);
        if ((flags & 0x40U) == 0) {
          uVar5 = RoundScalarWithFormatT<unsigned_int,int>
                            ((ImGui *)format,(char *)(ulong)(uint)data_type,uVar5,flags);
        }
        fVar14 = ScaleRatioFromValueT<unsigned_int,int,float>
                           (data_type,uVar5,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,
                            fVar12);
        fVar14 = fVar14 - fVar10;
        if (fVar17 <= 0.0) {
          fVar14 = (float)(~-(uint)(fVar17 <= fVar14) & (uint)fVar17 |
                          (uint)fVar14 & -(uint)(fVar17 <= fVar14));
        }
        else if (fVar17 <= fVar14) {
          fVar14 = fVar17;
        }
        fVar14 = pIVar3->SliderCurrentAccum - fVar14;
        bVar7 = true;
      }
      pIVar3->SliderCurrentAccum = fVar14;
      pIVar3->SliderCurrentAccumDirty = false;
      goto LAB_0016caf3;
    }
    fVar9 = 0.0;
    bVar7 = false;
  }
  else {
    fVar9 = 0.0;
    if (pIVar3->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar3->IO).MouseDown[0] != false) {
        if (0.0 < fVar17) {
          fVar17 = (*(float *)((pIVar3->IO).MouseDown + (ulong)(uVar6 >> 0x14) * 4 + -8) - fVar15) /
                   fVar17;
          fVar9 = 1.0;
          if (fVar17 <= 1.0) {
            fVar9 = fVar17;
          }
          fVar9 = (float)(~-(uint)(fVar17 < 0.0) & (uint)fVar9);
        }
        if (uVar6 != 0) {
          fVar9 = 1.0 - fVar9;
        }
        bVar7 = true;
        goto LAB_0016caf3;
      }
      ClearActiveID();
    }
    fVar9 = 0.0;
    bVar7 = false;
  }
LAB_0016caf3:
  if (bVar7) {
    uVar5 = ScaleValueFromRatioT<unsigned_int,int,float>
                      (data_type,fVar9,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,fVar12);
    if ((flags & 0x40U) == 0) {
      uVar5 = RoundScalarWithFormatT<unsigned_int,int>
                        ((ImGui *)format,(char *)(ulong)(uint)data_type,uVar5,flags);
    }
    bVar7 = *v != uVar5;
    if (bVar7) {
      *v = uVar5;
      bVar7 = true;
    }
  }
  else {
    bVar7 = false;
  }
LAB_0016cb69:
  if (1.0 <= fVar16) {
    fVar16 = ScaleRatioFromValueT<unsigned_int,int,float>
                       (data_type,*v,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,fVar12);
    if (uVar6 != 0) {
      fVar16 = 1.0 - fVar16;
    }
    fVar15 = (((fVar1 + -2.0) - fVar13 * 0.5) - fVar15) * fVar16 + fVar15;
    if (uVar6 != 0) {
      fVar1 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = -fVar13 * 0.5 + fVar15;
      (out_grab_bb->Max).x = fVar1 + -2.0;
      (out_grab_bb->Max).y = fVar13 * 0.5 + fVar15;
    }
    else {
      fVar1 = (bb->Min).y;
      fVar16 = (bb->Max).y;
      (out_grab_bb->Min).x = -fVar13 * 0.5 + fVar15;
      (out_grab_bb->Min).y = fVar1 + 2.0;
      (out_grab_bb->Max).x = fVar13 * 0.5 + fVar15;
      (out_grab_bb->Max).y = fVar16 + -2.0;
    }
  }
  else {
    IVar11 = bb->Min;
    out_grab_bb->Min = IVar11;
    out_grab_bb->Max = IVar11;
  }
  return bVar7;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}